

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged(secp256k1_sha256 *sha)

{
  secp256k1_sha256 *sha_local;
  
  secp256k1_sha256_initialize(sha);
  sha->s[0] = 0x791dae43;
  sha->s[1] = 0xe52d3b44;
  sha->s[2] = 0x37f9edea;
  sha->s[3] = 0x9bfd2ab1;
  sha->s[4] = 0xcfb0f44d;
  sha->s[5] = 0xccf1d880;
  sha->s[6] = 0xd18f2c13;
  sha->s[7] = 0xa37b9024;
  sha->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0x791dae43ul;
    sha->s[1] = 0xe52d3b44ul;
    sha->s[2] = 0x37f9edeaul;
    sha->s[3] = 0x9bfd2ab1ul;
    sha->s[4] = 0xcfb0f44dul;
    sha->s[5] = 0xccf1d880ul;
    sha->s[6] = 0xd18f2c13ul;
    sha->s[7] = 0xa37b9024ul;

    sha->bytes = 64;
}